

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxequilisc.hpp
# Opt level: O2

void soplex::SPxEquiliSC<double>::computeEquiExpVec
               (SVSetBase<double> *vecset,DataArray<int> *coScaleExp,DataArray<int> *scaleExp,
               double epsilon)

{
  Nonzero<double> *pNVar1;
  int j;
  long lVar2;
  Item *pIVar3;
  int i;
  long lVar4;
  long lVar5;
  ulong uVar6;
  double dVar7;
  double dVar8;
  
  for (lVar4 = 0; lVar4 < (vecset->set).thenum; lVar4 = lVar4 + 1) {
    pIVar3 = (vecset->set).theitem + (vecset->set).thekey[lVar4].idx;
    dVar8 = 0.0;
    lVar5 = 8;
    for (lVar2 = 0; lVar2 < (pIVar3->data).super_SVectorBase<double>.memused; lVar2 = lVar2 + 1) {
      pNVar1 = (pIVar3->data).super_SVectorBase<double>.m_elem;
      dVar7 = ldexp(*(double *)((long)pNVar1 + lVar5 + -8),
                    coScaleExp->data[*(int *)((long)&pNVar1->val + lVar5)]);
      uVar6 = -(ulong)(epsilon < ABS(dVar7) - dVar8);
      dVar8 = (double)(~uVar6 & (ulong)dVar8 | (ulong)ABS(dVar7) & uVar6);
      lVar5 = lVar5 + 0x10;
    }
    frexp((double)(-(ulong)(dVar8 == 0.0) & 0x3ff0000000000000 |
                  ~-(ulong)(dVar8 == 0.0) & (ulong)(1.0 / dVar8)),scaleExp->data + lVar4);
    scaleExp->data[lVar4] = scaleExp->data[lVar4] + -1;
  }
  return;
}

Assistant:

void SPxEquiliSC<R>::computeEquiExpVec(const SVSetBase<R>* vecset, const DataArray<int>& coScaleExp,
                                       DataArray<int>& scaleExp, R epsilon)
{
   assert(vecset != nullptr);

   for(int i = 0; i < vecset->num(); ++i)
   {
      const SVectorBase<R>& vec = (*vecset)[i];

      R maxi = 0.0;

      for(int j = 0; j < vec.size(); ++j)
      {
         const R x = spxAbs(spxLdexp(vec.value(j), coScaleExp[vec.index(j)]));

         if(GT(x, maxi, epsilon))
            maxi = x;
      }

      // empty rows/cols are possible
      if(maxi == 0.0)
         maxi = 1.0;

      assert(maxi > 0.0);

      spxFrexp(Real(1.0 / maxi), &(scaleExp[i]));

      scaleExp[i] -= 1;
   }
}